

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::SourceRange>::
emplace_back<slang::SourceLocation&,slang::SourceLocation&>
          (SmallVectorBase<slang::SourceRange> *this,SourceLocation *args,SourceLocation *args_1)

{
  SourceLocation SVar1;
  size_type sVar2;
  ulong uVar3;
  SourceLocation *pSVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pSVar7;
  pointer pSVar8;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar9;
  long lVar10;
  pointer pSVar11;
  
  pSVar11 = this->data_ + this->len;
  if (this->len != this->cap) {
    SVar1 = *args_1;
    pSVar11->startLoc = *args;
    pSVar11->endLoc = SVar1;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar9 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar9 < ctx) {
    pEVar9 = ctx;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    pEVar9 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar10 = (long)pSVar11 - (long)this->data_;
  pSVar5 = (pointer)operator_new((long)pEVar9 << 4);
  SVar1 = *args_1;
  *(SourceLocation *)((long)pSVar5 + lVar10) = *args;
  *(SourceLocation *)((long)pSVar5 + lVar10 + 8) = SVar1;
  pSVar8 = this->data_;
  pSVar6 = pSVar8 + this->len;
  pSVar7 = pSVar5;
  if (pSVar6 == pSVar11) {
    for (; pSVar8 != pSVar11; pSVar8 = pSVar8 + 1) {
      SVar1 = pSVar8->endLoc;
      pSVar7->startLoc = pSVar8->startLoc;
      pSVar7->endLoc = SVar1;
      pSVar7 = pSVar7 + 1;
    }
  }
  else {
    for (; pSVar8 != pSVar11; pSVar8 = pSVar8 + 1) {
      SVar1 = pSVar8->endLoc;
      pSVar7->startLoc = pSVar8->startLoc;
      pSVar7->endLoc = SVar1;
      pSVar7 = pSVar7 + 1;
    }
    pSVar4 = (SourceLocation *)((long)pSVar5 + lVar10);
    for (; pSVar11 != pSVar6; pSVar11 = pSVar11 + 1) {
      SVar1 = pSVar11->endLoc;
      pSVar4[2] = pSVar11->startLoc;
      pSVar4[3] = SVar1;
      pSVar4 = pSVar4 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar9;
  this->data_ = pSVar5;
  return (reference)((long)pSVar5 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }